

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

void __thiscall cfd::core::TapBranch::AddBranch(TapBranch *this,SchnorrPubkey *pubkey)

{
  ByteData256 local_28;
  
  SchnorrPubkey::GetByteData256(&local_28,pubkey);
  (*this->_vptr_TapBranch[3])(this,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TapBranch::AddBranch(const SchnorrPubkey& pubkey) {
  AddBranch(pubkey.GetByteData256());
}